

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldMapTest_CustomIndexMapKeyComparator_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_CustomIndexMapKeyComparator_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestDiffMessage_Item> *this_00;
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>_>
  *pVVar2;
  FieldDescriptor *field;
  Arena *pAVar3;
  pointer *__ptr;
  char *message;
  char *in_R9;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  OffsetByOneMapKeyComparator key_comparator;
  AssertHelper local_388;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string output;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&msg1.field_0._impl_.item_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"one",pAVar3);
  this_00 = &msg2.field_0._impl_.item_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"zero",pAVar3);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"one",pAVar3);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::MapKeyComparator::MapKeyComparator
            (&key_comparator.super_MapKeyComparator);
  key_comparator.super_MapKeyComparator._vptr_MapKeyComparator =
       (MapKeyComparator)&PTR__MapKeyComparator_0166f428;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"item",(allocator<char> *)&gtest_ar);
  field = GetFieldDescriptor(&msg1.super_Message,&output);
  util::MessageDifferencer::TreatAsMapUsingKeyComparator
            (&differencer,field,&key_comparator.super_MapKeyComparator);
  std::__cxx11::string::~string((string *)&output);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  util::MessageDifferencer::ReportDifferencesToString(&differencer,&output);
  bVar1 = util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_398);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0xf0d901,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9cc,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_398._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_398._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  testing::internal::CmpHelperEQ<char[72],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"moved: item[0] -> item[1] : { b: \\\"one\\\" }\\n\" \"added: item[0]: { b: \\\"zero\\\" }\\n\""
             ,"output",
             (char (*) [72])
             "moved: item[0] -> item[1] : { b: \"one\" }\nadded: item[0]: { b: \"zero\" }\n",&output
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9d0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_398,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_398);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&output);
  util::MessageDifferencer::MapKeyComparator::~MapKeyComparator
            (&key_comparator.super_MapKeyComparator);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_CustomIndexMapKeyComparator) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, using custom key comparator to determine if two
  // elements have the same key.
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->set_b("one");
  item = msg2.add_item();
  item->set_b("zero");
  item = msg2.add_item();
  item->set_b("one");
  util::MessageDifferencer differencer;
  OffsetByOneMapKeyComparator key_comparator;
  differencer.TreatAsMapUsingKeyComparator(GetFieldDescriptor(msg1, "item"),
                                           &key_comparator);
  std::string output;
  differencer.ReportDifferencesToString(&output);
  // With the offset by one comparator msg1.item[0] should be compared to
  // msg2.item[1] and thus be moved, msg2.item[0] should be marked as added.
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "moved: item[0] -> item[1] : { b: \"one\" }\n"
      "added: item[0]: { b: \"zero\" }\n",
      output);
}